

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ilist_base.h
# Opt level: O0

void llvm::ilist_base<false>::removeImpl(node_base_type *N)

{
  ilist_node_base<false> *Prev_00;
  ilist_node_base<false> *this;
  node_base_type *Next;
  node_base_type *Prev;
  node_base_type *N_local;
  
  Prev_00 = ilist_node_base<false>::getPrev(N);
  this = ilist_node_base<false>::getNext(N);
  ilist_node_base<false>::setPrev(this,Prev_00);
  ilist_node_base<false>::setNext(Prev_00,this);
  ilist_node_base<false>::setPrev(N,(ilist_node_base<false> *)0x0);
  ilist_node_base<false>::setNext(N,(ilist_node_base<false> *)0x0);
  return;
}

Assistant:

static void removeImpl(node_base_type &N) {
    node_base_type *Prev = N.getPrev();
    node_base_type *Next = N.getNext();
    Next->setPrev(Prev);
    Prev->setNext(Next);

    // Not strictly necessary, but helps catch a class of bugs.
    N.setPrev(nullptr);
    N.setNext(nullptr);
  }